

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestMessageSetLite::_InternalSerialize
          (TestMessageSetLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  string *unknown_fields;
  
  puVar2 = google::protobuf::internal::ExtensionSet::
           InternalSerializeMessageSetWithCachedSizesToArray
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestMessageSetLite_default_instance_,target,stream);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    google::protobuf::internal::InitProtobufDefaults();
    unknown_fields = (string *)&google::protobuf::internal::fixed_address_empty_string;
  }
  else {
    unknown_fields = (string *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  puVar2 = google::protobuf::internal::InternalSerializeUnknownMessageSetItemsToArray
                     (unknown_fields,puVar2,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageSetLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageSetLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
   target =
      this_._impl_._extensions_
          .InternalSerializeMessageSetWithCachedSizesToArray(
              &default_instance(), target, stream);
  target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
      this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString), target, stream);
  return target;
}